

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O3

void * SstFFSGetBlocksInfo(SstStream Stream,void *Variable)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  size_t *psVar7;
  long *plVar8;
  FFSReaderMarshalBase *Info;
  ulong uVar9;
  long lVar10;
  
  piVar1 = (int *)Stream->ReaderMarshalData;
  if (0 < (long)*piVar1) {
    lVar6 = 0;
    do {
      plVar8 = *(long **)(*(long *)(piVar1 + 2) + lVar6 * 8);
      if ((void *)*plVar8 == Variable) goto LAB_00115d33;
      lVar6 = lVar6 + 1;
    } while (*piVar1 != lVar6);
  }
  plVar8 = (long *)0x0;
LAB_00115d33:
  if (Stream->MinArraySetupUpcall == (MinArraySetupUpcallFunc)0x0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = (*Stream->MinArraySetupUpcall)
                       (Stream->SetupUpcallReader,
                        *(int *)(**(long **)(piVar1 + 8) + *(long *)plVar8[2]),
                        *(size_t **)(**(long **)(piVar1 + 8) + 0x10 + *(long *)plVar8[2]));
    iVar5 = Stream->WriterCohortSize;
    if (0 < iVar5) {
      lVar6 = plVar8[7];
      lVar10 = 0;
      do {
        if (*(long *)(lVar6 + lVar10 * 8) != 0) {
          lVar2 = *(long *)(*(long *)(piVar1 + 8) + lVar10 * 8);
          lVar3 = *(long *)(plVar8[2] + lVar10 * 8);
          uVar9 = 0;
          do {
            lVar6 = *(long *)(lVar2 + 0x20 + lVar3);
            psVar7 = (size_t *)(lVar6 + *(long *)(lVar2 + lVar3) * uVar9 * 8);
            if (lVar6 == 0) {
              psVar7 = (size_t *)0x0;
            }
            (*Stream->ArrayBlocksInfoUpcall)
                      (Stream->SetupUpcallReader,pvVar4,(int)plVar8[4],(int)lVar10,
                       (int)*(long *)(lVar2 + lVar3),*(size_t **)(lVar2 + 0x10 + lVar3),psVar7,
                       *(size_t **)(lVar2 + 0x18 + lVar3));
            uVar9 = uVar9 + 1;
            lVar6 = plVar8[7];
          } while (uVar9 < *(ulong *)(lVar6 + lVar10 * 8));
          iVar5 = Stream->WriterCohortSize;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar5);
    }
  }
  return pvVar4;
}

Assistant:

extern void *SstFFSGetBlocksInfo(SstStream Stream, void *Variable)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    FFSVarRec VarRec = LookupVarByKey(Stream, Variable);
    MetaArrayRec *meta_base = (MetaArrayRec *)(((char *)Info->MetadataBaseAddrs[0]) +
                                               VarRec->PerWriterMetaFieldOffset[0]);
    if (!Stream->MinArraySetupUpcall)
        return NULL;

    void *Ret = Stream->MinArraySetupUpcall(Stream->SetupUpcallReader, (int)meta_base->Dims,
                                            meta_base->Shape);
    for (int WriterRank = 0; WriterRank < Stream->WriterCohortSize; WriterRank++)
    {
        meta_base = (MetaArrayRec *)(((char *)Info->MetadataBaseAddrs[WriterRank]) +
                                     VarRec->PerWriterMetaFieldOffset[WriterRank]);

        for (int i = 0; i < VarRec->PerWriterBlockCount[WriterRank]; i++)
        {
            size_t *Offsets = NULL;
            if (meta_base->Offsets)
                Offsets = meta_base->Offsets + (i * meta_base->Dims);
            Stream->ArrayBlocksInfoUpcall(Stream->SetupUpcallReader, Ret, VarRec->Type, WriterRank,
                                          (int)meta_base->Dims, meta_base->Shape, Offsets,
                                          meta_base->Count);
        }
    }
    return Ret;
}